

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

void __thiscall
cmFindPackageCommandHoldFile::~cmFindPackageCommandHoldFile(cmFindPackageCommandHoldFile *this)

{
  char *pcVar1;
  allocator local_31;
  string local_30;
  cmFindPackageCommandHoldFile *local_10;
  cmFindPackageCommandHoldFile *this_local;
  
  if (this->File != (char *)0x0) {
    pcVar1 = this->File;
    local_10 = this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_30,pcVar1,&local_31);
    cmsys::SystemTools::RemoveFile(&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  return;
}

Assistant:

~cmFindPackageCommandHoldFile()
  {
    if (this->File) {
      cmSystemTools::RemoveFile(this->File);
    }
  }